

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf.c
# Opt level: O3

int line_compare(void *v1,void *v2)

{
  uint uVar1;
  
  uVar1 = 0xffffffff;
  if ((*v2 <= *v1) && (uVar1 = 1, *v1 <= *v2)) {
    uVar1 = 0xffffffff;
    if (*(int *)((long)v2 + 0x14) <= *(int *)((long)v1 + 0x14)) {
      uVar1 = (uint)(*(int *)((long)v2 + 0x14) < *(int *)((long)v1 + 0x14));
    }
  }
  return uVar1;
}

Assistant:

static int
line_compare (const void *v1, const void *v2)
{
  const struct line *ln1 = (const struct line *) v1;
  const struct line *ln2 = (const struct line *) v2;

  if (ln1->pc < ln2->pc)
    return -1;
  else if (ln1->pc > ln2->pc)
    return 1;
  else if (ln1->idx < ln2->idx)
    return -1;
  else if (ln1->idx > ln2->idx)
    return 1;
  else
    return 0;
}